

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::COBImporter::ReadUnit_Binary
          (COBImporter *this,Scene *out,StreamReaderLE *reader,ChunkInfo *nfo)

{
  bool bVar1;
  int16_t iVar2;
  element_type *peVar3;
  Logger *pLVar4;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar5;
  basic_formatter *pbVar6;
  float local_40c;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  string local_268;
  undefined4 local_248;
  byte local_242;
  byte local_241;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_c8;
  uint local_94;
  __shared_ptr_access<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Stack_90;
  uint t;
  shared_ptr<Assimp::COB::Node> *nd;
  iterator __end1;
  iterator __begin1;
  NodeList *__range1;
  chunk_guard cn;
  ChunkInfo *nfo_local;
  StreamReaderLE *reader_local;
  Scene *out_local;
  COBImporter *this_local;
  
  cn.cur = (long)nfo;
  if (nfo->version < 2) {
    chunk_guard::chunk_guard((chunk_guard *)&__range1,nfo,reader);
    std::
    deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
    ::begin((iterator *)&__end1._M_node,&out->nodes);
    std::
    deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
    ::end((iterator *)&nd,&out->nodes);
    while (bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&nd), bVar1) {
      p_Stack_90 = (__shared_ptr_access<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)std::
                      _Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
                      ::operator*((_Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
                                   *)&__end1._M_node);
      peVar3 = std::__shared_ptr_access<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Stack_90);
      if ((peVar3->super_ChunkInfo).id == *(uint *)(cn.cur + 4)) {
        iVar2 = StreamReader<false,_false>::GetI2(reader);
        local_94 = (uint)iVar2;
        local_241 = 0;
        local_242 = 0;
        if (local_94 < 8) {
          local_40c = units[local_94];
        }
        else {
          pLVar4 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<unsigned_int>(&local_240,&local_94);
          local_241 = 1;
          pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             &local_240,
                             (char (*) [61])
                             " is not a valid value for `Units` attribute in `Unit chunk` ");
          pbVar6 = (basic_formatter *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_(pbVar5,(uint *)cn.cur);
          Formatter::basic_formatter::operator_cast_to_string(&local_c8,pbVar6);
          local_242 = 1;
          Logger::warn(pLVar4,&local_c8);
          local_40c = 1.0;
        }
        peVar3 = std::
                 __shared_ptr_access<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Stack_90);
        peVar3->unit_scale = local_40c;
        if ((local_242 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_c8);
        }
        if ((local_241 & 1) != 0) {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter(&local_240);
        }
        local_248 = 1;
        goto LAB_007b5e89;
      }
      std::
      _Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
      ::operator++((_Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
                    *)&__end1._M_node);
    }
    pLVar4 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[14]>(&local_3e0,(char (*) [14])0xbc4231);
    pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_3e0,(uint *)cn.cur);
    pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar5,(char (*) [16])" is a child of ");
    pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar5,(uint *)(cn.cur + 4));
    pbVar6 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar5,(char (*) [22])" which does not exist");
    Formatter::basic_formatter::operator_cast_to_string(&local_268,pbVar6);
    Logger::warn(pLVar4,&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_3e0);
    local_248 = 0;
LAB_007b5e89:
    chunk_guard::~chunk_guard((chunk_guard *)&__range1);
  }
  else {
    UnsupportedChunk_Binary(this,reader,nfo,"Unit");
  }
  return;
}

Assistant:

void COBImporter::ReadUnit_Binary(COB::Scene& out, StreamReaderLE& reader, const ChunkInfo& nfo)
{
     if(nfo.version > 1) {
        return UnsupportedChunk_Binary(reader,nfo,"Unit");
    }

     const chunk_guard cn(nfo,reader);

    // parent chunks preceede their childs, so we should have the
    // corresponding chunk already.
    for(std::shared_ptr< Node >& nd : out.nodes) {
        if (nd->id == nfo.parent_id) {
            const unsigned int t=reader.GetI2();
            nd->unit_scale = t>=sizeof(units)/sizeof(units[0])?(
                ASSIMP_LOG_WARN_F(t," is not a valid value for `Units` attribute in `Unit chunk` ", nfo.id)
                ,1.f):units[t];

            return;
        }
    }
    ASSIMP_LOG_WARN_F( "`Unit` chunk ", nfo.id, " is a child of ", nfo.parent_id, " which does not exist");
}